

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyImplementations.h
# Opt level: O3

void __thiscall iDynTree::DummyLight::~DummyLight(DummyLight *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ILight)._vptr_ILight = (_func_int **)&PTR__DummyLight_0010c9f0;
  pcVar2 = (this->dummyName)._M_dataplus._M_p;
  paVar1 = &(this->dummyName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~DummyLight() {}